

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O0

void gray_render_span(int count,QT_FT_Span *spans,PWorker worker)

{
  byte bVar1;
  byte *__s;
  long in_RDX;
  int *in_RSI;
  int in_EDI;
  uchar *q;
  uchar coverage;
  QT_FT_Bitmap *map;
  uchar *p;
  byte *local_38;
  long local_20;
  int *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  do {
    if (local_4 < 1) {
      return;
    }
    bVar1 = *(byte *)(local_10 + 3);
    local_20 = *(long *)(in_RDX + 0xb0) - (long)(local_10[2] * *(int *)(in_RDX + 0xa8));
    if (-1 < *(int *)(in_RDX + 0xa8)) {
      local_20 = local_20 + (ulong)(uint)((*(int *)(in_RDX + 0xa0) + -1) * *(int *)(in_RDX + 0xa8));
    }
    if (bVar1 != 0) {
      __s = (byte *)(local_20 + *local_10);
      local_38 = __s;
      switch(local_10[1]) {
      case 7:
        local_38 = __s + 1;
        *__s = bVar1;
      case 6:
        *local_38 = bVar1;
        local_38 = local_38 + 1;
      case 5:
        *local_38 = bVar1;
        local_38 = local_38 + 1;
      case 4:
        *local_38 = bVar1;
        local_38 = local_38 + 1;
      case 3:
        *local_38 = bVar1;
        local_38 = local_38 + 1;
      case 2:
        *local_38 = bVar1;
        local_38 = local_38 + 1;
      case 1:
        *local_38 = bVar1;
      case 0:
        break;
      default:
        memset(__s,(uint)bVar1,(long)local_10[1]);
      }
    }
    local_4 = local_4 + -1;
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

static void
  gray_render_span( int                count,
                    const QT_FT_Span*  spans,
                    PWorker            worker )
  {
    unsigned char*  p;
    QT_FT_Bitmap*      map = &worker->target;

    for ( ; count > 0; count--, spans++ )
    {
      unsigned char  coverage = spans->coverage;

      /* first of all, compute the scanline offset */
      p = (unsigned char*)map->buffer - spans->y * map->pitch;
      if ( map->pitch >= 0 )
        p += ( map->rows - 1 ) * (unsigned int)map->pitch;


      if ( coverage )
      {
        unsigned char*  q = p + spans->x;


        /* For small-spans it is faster to do it by ourselves than
         * calling `memset'.  This is mainly due to the cost of the
         * function call.
         */
        switch ( spans->len )
        {
        case 7: *q++ = coverage; Q_FALLTHROUGH();
        case 6: *q++ = coverage; Q_FALLTHROUGH();
        case 5: *q++ = coverage; Q_FALLTHROUGH();
        case 4: *q++ = coverage; Q_FALLTHROUGH();
        case 3: *q++ = coverage; Q_FALLTHROUGH();
        case 2: *q++ = coverage; Q_FALLTHROUGH();
        case 1: *q   = coverage; Q_FALLTHROUGH();
        case 0: break;
        default:
          QT_FT_MEM_SET( q, coverage, spans->len );
        }
      }
    }
  }